

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O0

int __thiscall HebrewCalendar::operator_cast_to_int(HebrewCalendar *this)

{
  int iVar1;
  int local_1c;
  int d;
  int m_1;
  int m;
  int DayInYear;
  HebrewCalendar *this_local;
  
  m_1 = (this->super_Calendar).day;
  if ((this->super_Calendar).month < 7) {
    for (d = 7; iVar1 = LastMonthOfHebrewYear(this,(this->super_Calendar).year), d <= iVar1;
        d = d + 1) {
      iVar1 = LastMonthDay(this,d,(this->super_Calendar).year);
      m_1 = m_1 + iVar1;
    }
    for (d = 1; d < (this->super_Calendar).month; d = d + 1) {
      iVar1 = LastMonthDay(this,d,(this->super_Calendar).year);
      m_1 = m_1 + iVar1;
    }
  }
  else {
    for (local_1c = 7; local_1c < (this->super_Calendar).month; local_1c = local_1c + 1) {
      iVar1 = LastMonthDay(this,local_1c,(this->super_Calendar).year);
      m_1 = m_1 + iVar1;
    }
  }
  iVar1 = HebrewCalendarElapsedDays(this,(this->super_Calendar).year);
  return m_1 + iVar1 + -0x14f4f5;
}

Assistant:

HebrewCalendar::operator int() { // Computes the absolute date of HebrewCalendar date.
    int DayInYear = day; // Days so far this month.
    if (month < 7) { // Before Tishri, so add days in prior months
        // this year before and after Nisan.
        int m = 7;
        while (m <= (LastMonthOfHebrewYear(year))) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        };
        m = 1;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    else { // Add days in prior months this year
        int m = 7;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    int d = DayInYear +
            (HebrewCalendarElapsedDays(year)// Days in prior years.
                    + HebrewEpoch);
    return d;         // Days elapsed before absolute date 1.
}